

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ValueFederateExport.cpp
# Opt level: O0

HelicsTime helicsInputGetTime(HelicsInput inp,HelicsError *err)

{
  InputObject *pIVar1;
  TimeRepresentation<count_time<9,_long>_> time;
  InputObject *inpObj;
  Input *in_stack_ffffffffffffffb8;
  HelicsError *in_stack_ffffffffffffffc0;
  HelicsInput in_stack_ffffffffffffffc8;
  undefined8 local_8;
  
  pIVar1 = anon_unknown.dwarf_5d1c2::verifyInput
                     (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0);
  if (pIVar1 == (InputObject *)0x0) {
    local_8 = -1.785e+39;
  }
  else {
    helics::Input::getValue<TimeRepresentation<count_time<9,long>>>(in_stack_ffffffffffffffb8);
    local_8 = TimeRepresentation::operator_cast_to_double
                        ((TimeRepresentation<count_time<9,_long>_> *)0x1cf673);
  }
  return local_8;
}

Assistant:

HelicsTime helicsInputGetTime(HelicsInput inp, HelicsError* err)
{
    auto* inpObj = verifyInput(inp, err);
    if (inpObj == nullptr) {
        return HELICS_TIME_INVALID;
    }
    try {
        auto time = inpObj->inputPtr->getValue<helics::Time>();
        return static_cast<HelicsTime>(time);
    }
    // LCOV_EXCL_START
    catch (...) {
        helicsErrorHandler(err);
        return HELICS_TIME_INVALID;
    }
    // LCOV_EXCL_STOP
}